

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiViewportFlags *pIVar1;
  ImGuiID *pIVar2;
  ImGuiID *pIVar3;
  float fVar4;
  ImVec2 IVar5;
  ImGuiID IVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  ImGuiViewportP *pIVar10;
  ImGuiContext *g;
  float fVar11;
  float fVar12;
  ImVec2 pos;
  ImVec2 local_30;
  ImVec2 local_28;
  undefined8 uStack_20;
  
  pIVar8 = GImGui;
  pIVar7 = GImGui->MovingWindow;
  if (pIVar7 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar6 = GImGui->ActiveIdWindow->MoveId;
    if (IVar6 != GImGui->ActiveId) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar6;
    if (pIVar8->ActiveIdPreviousFrame == IVar6) {
      pIVar8->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar8->IO).MouseDown[0] != false) {
      return;
    }
    SetActiveID(0,(ImGuiWindow *)0x0);
    return;
  }
  pIVar2 = &GImGui->ActiveId;
  pIVar3 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar2;
  if (*pIVar3 == *pIVar2) {
    pIVar8->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar7 = pIVar7->RootWindow;
  if ((pIVar8->IO).MouseDown[0] != true) {
LAB_00151ecf:
    pIVar9 = pIVar8;
    if ((pIVar8->ConfigFlagsCurrFrame & 0x400) != 0) {
      UpdateTryMergeWindowIntoHostViewport(pIVar7,pIVar8->MouseViewport);
      pIVar9 = GImGui;
    }
    if ((pIVar9->DragDropActive == true) && (pIVar9->DragDropAcceptIdPrev != 0)) {
      pIVar10 = pIVar7->Viewport;
    }
    else {
      pIVar10 = pIVar7->Viewport;
      pIVar8->MouseViewport = pIVar10;
    }
    pIVar1 = &(pIVar10->super_ImGuiViewport).Flags;
    *(byte *)pIVar1 = (byte)*pIVar1 & 0xef;
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar8->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar5 = (pIVar8->IO).MousePos;
  fVar11 = IVar5.x;
  fVar12 = IVar5.y;
  if ((fVar11 < -256000.0) || (fVar12 < -256000.0)) goto LAB_00151ecf;
  fVar11 = fVar11 - (pIVar8->ActiveIdClickOffset).x;
  fVar12 = fVar12 - (pIVar8->ActiveIdClickOffset).y;
  local_30.y = fVar12;
  local_30.x = fVar11;
  fVar4 = (pIVar7->Pos).x;
  if ((fVar4 == fVar11) && (!NAN(fVar4) && !NAN(fVar11))) {
    fVar4 = (pIVar7->Pos).y;
    if ((fVar4 == fVar12) && (!NAN(fVar4) && !NAN(fVar12))) goto LAB_00151ebe;
  }
  local_28.y = fVar12;
  local_28.x = fVar11;
  uStack_20 = 0;
  if (((pIVar7->Flags & 0x100) == 0) && (pIVar8->SettingsDirtyTimer <= 0.0)) {
    pIVar8->SettingsDirtyTimer = (pIVar8->IO).IniSavingRate;
  }
  SetWindowPos(pIVar7,&local_30,1);
  if (pIVar7->ViewportOwned == true) {
    (pIVar7->Viewport->super_ImGuiViewport).Pos = local_28;
  }
LAB_00151ebe:
  FocusWindow(pIVar8->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
                if (moving_window->ViewportOwned) // Synchronize viewport immediately because some overlays may relies on clipping rectangle before we Begin() into the window.
                    moving_window->Viewport->Pos = pos;
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            // Try to merge the window back into the main viewport.
            // This works because MouseViewport should be != MovingWindow->Viewport on release (as per code in UpdateViewports)
            if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
                UpdateTryMergeWindowIntoHostViewport(moving_window, g.MouseViewport);

            // Restore the mouse viewport so that we don't hover the viewport _under_ the moved window during the frame we released the mouse button.
            if (!IsDragDropPayloadBeingAccepted())
                g.MouseViewport = moving_window->Viewport;

            // Clear the NoInput window flag set by the Viewport system
            moving_window->Viewport->Flags &= ~ImGuiViewportFlags_NoInputs;

            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}